

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadField(BinaryReader *this,TypeMut *out_value)

{
  char *pcVar1;
  bool bVar2;
  Enum EVar3;
  Result result;
  byte local_2d;
  Enum local_2c;
  Result RStack_28;
  uint8_t mutable_;
  Type local_24;
  TypeMut *pTStack_20;
  Type field_type;
  TypeMut *out_value_local;
  BinaryReader *this_local;
  
  pTStack_20 = out_value;
  RStack_28 = ReadType(this,&local_24,"field type");
  bVar2 = Failed(RStack_28);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_2c = local_24.enum_;
    bVar2 = IsConcreteType(this,local_24);
    if (bVar2) {
      local_2d = 0;
      result = ReadU8(this,&local_2d,"field mutability");
      bVar2 = Failed(result);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else if (local_2d < 2) {
        (pTStack_20->type).enum_ = local_24.enum_;
        pTStack_20->mutable_ = local_2d != 0;
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
      else {
        PrintError(this,"field mutability must be 0 or 1");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      EVar3 = Type::operator_cast_to_Enum(&local_24);
      pcVar1 = "\n\n";
      if (EVar3 < Any) {
        pcVar1 = "  -";
      }
      EVar3 = Type::operator_cast_to_Enum(&local_24);
      if (EVar3 < ~I64) {
        EVar3 = -EVar3;
      }
      PrintError(this,"expected valid field type (got %s%#x)",pcVar1 + 2,(ulong)(uint)EVar3);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadField(TypeMut* out_value) {
  // TODO: Reuse for global header too?
  Type field_type;
  CHECK_RESULT(ReadType(&field_type, "field type"));
  ERROR_UNLESS(IsConcreteType(field_type),
               "expected valid field type (got " PRItypecode ")",
               WABT_PRINTF_TYPE_CODE(field_type));

  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadU8(&mutable_, "field mutability"));
  ERROR_UNLESS(mutable_ <= 1, "field mutability must be 0 or 1");
  out_value->type = field_type;
  out_value->mutable_ = mutable_;
  return Result::Ok;
}